

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_codeptr.cpp
# Opt level: O1

int AF_A_JumpIfInTargetLOS(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  AActor *this;
  double dVar2;
  PClass *pPVar3;
  int iVar4;
  undefined4 extraout_var;
  PClass *pPVar5;
  anon_union_8_2_947301c2_for_TObjPtr<AActor>_1 *paVar6;
  uint uVar7;
  uint uVar8;
  void *val;
  char *pcVar9;
  AActor *other;
  bool bVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  FState *state;
  _func_int **local_38;
  
  pPVar3 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    pcVar9 = "(paramnum) < numparam";
LAB_00653987:
    __assert_fail(pcVar9,
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                  ,0x11b5,
                  "int AF_A_JumpIfInTargetLOS(VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  if (((param->field_0).field_3.Type != '\x03') ||
     (((param->field_0).field_1.atag != 1 && ((param->field_0).field_1.a != (void *)0x0)))) {
    pcVar9 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
    goto LAB_00653987;
  }
  this = *(AActor **)&param->field_0;
  if (this != (AActor *)0x0) {
    if ((this->super_DThinker).super_DObject.Class == (PClass *)0x0) {
      iVar4 = (**(this->super_DThinker).super_DObject._vptr_DObject)(this);
      (this->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar4);
    }
    pPVar5 = (this->super_DThinker).super_DObject.Class;
    bVar10 = pPVar5 != (PClass *)0x0;
    if (pPVar5 != pPVar3 && bVar10) {
      do {
        pPVar5 = pPVar5->ParentClass;
        bVar10 = pPVar5 != (PClass *)0x0;
        if (pPVar5 == pPVar3) break;
      } while (pPVar5 != (PClass *)0x0);
    }
    if (!bVar10) {
      pcVar9 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_00653987;
    }
  }
  if (numparam == 1) {
    pcVar9 = "(paramnum) < numparam";
LAB_00653968:
    __assert_fail(pcVar9,
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                  ,0x11b6,
                  "int AF_A_JumpIfInTargetLOS(VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  if ((param[1].field_0.field_3.Type != '\x03') ||
     ((param[1].field_0.field_1.atag != 7 && (param[1].field_0.field_1.a != (void *)0x0)))) {
    pcVar9 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATE || param[paramnum].a == NULL)"
    ;
    goto LAB_00653968;
  }
  val = param[1].field_0.field_1.a;
  uVar11 = 0;
  uVar12 = 0;
  if (2 < numparam) {
    VVar1 = param[2].field_0.field_3.Type;
    if (VVar1 == '\x01') {
      uVar11 = (undefined4)*(undefined8 *)&param[2].field_0;
      uVar12 = (undefined4)((ulong)*(undefined8 *)&param[2].field_0 >> 0x20);
    }
    else if (VVar1 != 0xff) {
      __assert_fail("param[paramnum].Type == REGT_FLOAT",
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                    ,0x11b7,
                    "int AF_A_JumpIfInTargetLOS(VMFrameStack *, VMValue *, int, VMReturn *, int)");
    }
  }
  uVar7 = 0;
  if (3 < numparam) {
    VVar1 = param[3].field_0.field_3.Type;
    if (VVar1 == '\0') {
      uVar7 = param[3].field_0.i;
    }
    else {
      uVar7 = 0;
      if (VVar1 != 0xff) {
        __assert_fail("param[paramnum].Type == REGT_INT",
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                      ,0x11b8,
                      "int AF_A_JumpIfInTargetLOS(VMFrameStack *, VMValue *, int, VMReturn *, int)")
        ;
      }
    }
  }
  dVar13 = 0.0;
  dVar15 = 0.0;
  if (4 < numparam) {
    VVar1 = param[4].field_0.field_3.Type;
    if (VVar1 == '\x01') {
      dVar15 = param[4].field_0.f;
    }
    else if (VVar1 != 0xff) {
      __assert_fail("param[paramnum].Type == REGT_FLOAT",
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                    ,0x11b9,
                    "int AF_A_JumpIfInTargetLOS(VMFrameStack *, VMValue *, int, VMReturn *, int)");
    }
  }
  if (5 < numparam) {
    VVar1 = param[5].field_0.field_3.Type;
    if (VVar1 == '\x01') {
      dVar13 = param[5].field_0.f;
    }
    else if (VVar1 != 0xff) {
      __assert_fail("param[paramnum].Type == REGT_FLOAT",
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                    ,0x11ba,
                    "int AF_A_JumpIfInTargetLOS(VMFrameStack *, VMValue *, int, VMReturn *, int)");
    }
  }
  if ((uVar7 & 0x40) == 0) {
    if ((*(byte *)((long)&(this->flags).Value + 2) & (byte)uVar7 & 1) == 0) {
      other = (this->target).field_0.p;
      if ((other != (AActor *)0x0) &&
         (((other->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
        paVar6 = &(this->target).field_0;
        goto LAB_0065367e;
      }
    }
    else {
      if (((this->flags2).Value & 0x40000000) == 0) goto LAB_00653685;
      other = (this->tracer).field_0.p;
      if ((other != (AActor *)0x0) &&
         (((other->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
        paVar6 = &(this->tracer).field_0;
        goto LAB_0065367e;
      }
    }
  }
  else {
    other = (this->master).field_0.p;
    if ((other != (AActor *)0x0) &&
       (((other->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
      paVar6 = &(this->master).field_0;
LAB_0065367e:
      paVar6->p = (AActor *)0x0;
LAB_00653685:
      other = (AActor *)0x0;
    }
  }
  if (other == (AActor *)0x0) {
    if (numret < 1) {
      return 0;
    }
    if (ret == (VMReturn *)0x0) {
      __assert_fail("ret != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                    ,0x11d0,
                    "int AF_A_JumpIfInTargetLOS(VMFrameStack *, VMValue *, int, VMReturn *, int)");
    }
  }
  else if (((uVar7 & 0x20) == 0) || (0 < other->health)) {
    dVar14 = (double)CONCAT44(uVar12,uVar11);
    dVar2 = AActor::Distance3D(this,other,false);
    if (((dVar15 == 0.0) && (!NAN(dVar15))) || (dVar2 <= dVar15)) {
      uVar8 = uVar7 & 2;
      if (((dVar13 != 0.0) || (NAN(dVar13))) && (dVar2 < dVar13)) {
        if ((uVar7 & 0x10) != 0) {
          if (numret < 1) {
            return 0;
          }
          if (ret == (VMReturn *)0x0) {
            __assert_fail("ret != NULL",
                          "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                          ,0x11e5,
                          "int AF_A_JumpIfInTargetLOS(VMFrameStack *, VMValue *, int, VMReturn *, int)"
                         );
          }
          goto LAB_0065391a;
        }
        if ((uVar7 & 4) != 0) {
          dVar14 = 0.0;
        }
        uVar8 = uVar7 & 10;
      }
      if ((0.0 < dVar14) && (dVar14 < 360.0)) {
        iVar4 = 0;
        AActor::AngleTo((AActor *)&stack0xffffffffffffffc8,other,SUB81(this,0));
        dVar15 = ABS((double)SUB84(((double)local_38 - (other->Angles).Yaw.Degrees) *
                                   11930464.711111112 + 6755399441055744.0,0) *
                     8.381903171539307e-08);
        if ((dVar14 * 0.5 < dVar15) && (0 < numret)) {
          if (ret == (VMReturn *)0x0) {
            __assert_fail("ret != NULL",
                          "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                          ,0x11f4,
                          "int AF_A_JumpIfInTargetLOS(VMFrameStack *, VMValue *, int, VMReturn *, int)"
                         );
          }
          VMReturn::SetPointer(ret,(void *)0x0,7);
          iVar4 = 1;
        }
        if (dVar14 * 0.5 < dVar15) {
          return iVar4;
        }
      }
      if ((uVar8 != 0) || (bVar10 = P_CheckSight(other,this,1), bVar10)) {
        if (numret < 1) {
          return 0;
        }
        if (ret == (VMReturn *)0x0) {
          __assert_fail("ret != NULL",
                        "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                        ,0x11fb,
                        "int AF_A_JumpIfInTargetLOS(VMFrameStack *, VMValue *, int, VMReturn *, int)"
                       );
        }
        goto LAB_0065391c;
      }
      if (numret < 1) {
        return 0;
      }
      if (ret == (VMReturn *)0x0) {
        __assert_fail("ret != NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                      ,0x11f9,
                      "int AF_A_JumpIfInTargetLOS(VMFrameStack *, VMValue *, int, VMReturn *, int)")
        ;
      }
    }
    else {
      if (numret < 1) {
        return 0;
      }
      if (ret == (VMReturn *)0x0) {
        __assert_fail("ret != NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                      ,0x11dc,
                      "int AF_A_JumpIfInTargetLOS(VMFrameStack *, VMValue *, int, VMReturn *, int)")
        ;
      }
    }
  }
  else {
    if (numret < 1) {
      return 0;
    }
    if (ret == (VMReturn *)0x0) {
      __assert_fail("ret != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                    ,0x11d5,
                    "int AF_A_JumpIfInTargetLOS(VMFrameStack *, VMValue *, int, VMReturn *, int)");
    }
  }
LAB_0065391a:
  val = (void *)0x0;
LAB_0065391c:
  VMReturn::SetPointer(ret,val,7);
  return 1;
}

Assistant:

DEFINE_ACTION_FUNCTION_PARAMS(AActor, A_JumpIfInTargetLOS)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_STATE		(jump);
	PARAM_ANGLE_OPT	(fov)			{ fov = 0.; }
	PARAM_INT_OPT	(flags)			{ flags = 0; }
	PARAM_FLOAT_OPT	(dist_max)		{ dist_max = 0; }
	PARAM_FLOAT_OPT	(dist_close)	{ dist_close = 0; }

	AActor *target;

	if (flags & JLOSF_CHECKMASTER)
	{
		target = self->master;
	}
	else if (self->flags & MF_MISSILE && (flags & JLOSF_PROJECTILE))
	{
		if (self->flags2 & MF2_SEEKERMISSILE)
			target = self->tracer;
		else
			target = NULL;
	}
	else
	{
		target = self->target;
	}

	if (target == NULL)
	{ // [KS] Let's not call P_CheckSight unnecessarily in this case.
		ACTION_RETURN_STATE(NULL);
	}

	if ((flags & JLOSF_DEADNOJUMP) && (target->health <= 0))
	{
		ACTION_RETURN_STATE(NULL);
	}

	double distance = self->Distance3D(target);

	if (dist_max && (distance > dist_max))
	{
		ACTION_RETURN_STATE(NULL);
	}

	bool doCheckSight = !(flags & JLOSF_NOSIGHT);

	if (dist_close && (distance < dist_close))
	{
		if (flags & JLOSF_CLOSENOJUMP)
		{
			ACTION_RETURN_STATE(NULL);
		}
		if (flags & JLOSF_CLOSENOFOV)
			fov = 0.;

		if (flags & JLOSF_CLOSENOSIGHT)
			doCheckSight = false;
	}

	if (fov > 0 && (fov < 360.))
	{
		DAngle an = absangle(target->AngleTo(self), target->Angles.Yaw);

		if (an > (fov / 2))
		{
			ACTION_RETURN_STATE(NULL); // [KS] Outside of FOV - return
		}
	}
	if (doCheckSight && !P_CheckSight (target, self, SF_IGNOREVISIBILITY))
	{
		ACTION_RETURN_STATE(NULL);
	}
	ACTION_RETURN_STATE(jump);
}